

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

string * __thiscall
slang::CommandLine::addRenameCommand_abi_cxx11_
          (string *__return_storage_ptr__,CommandLine *this,string_view value)

{
  size_type __n;
  size_type sVar1;
  mapped_type *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  allocator<char> local_69;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  string_view slangName;
  key_type local_48;
  
  local_68._M_str = value._M_str;
  local_68._M_len = value._M_len;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_68,',',0);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&local_68,',',0xffffffffffffffff);
  if ((__n == 0xffffffffffffffff) || (__n != sVar1)) {
    local_48._M_dataplus._M_p = local_68._M_str;
    local_48._M_string_length = local_68._M_len;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x27;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_48;
    ::fmt::v9::vformat_abi_cxx11_
              (__return_storage_ptr__,(v9 *)"missing or extra comma in argument \'{}\'",fmt,args);
  }
  else {
    slangName = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&local_68,__n + 1,0xffffffffffffffff);
    local_68 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_68,0,__n);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_48,&local_68,&local_69);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->cmdRename,&local_48);
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)this_00,&slangName);
    std::__cxx11::string::~string((string *)&local_48);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::addRenameCommand(string_view value) {
    const size_t firstCommaIndex = value.find_first_of(',');
    const size_t lastCommaIndex = value.find_last_of(',');
    if (firstCommaIndex == string_view::npos || firstCommaIndex != lastCommaIndex)
        return fmt::format("missing or extra comma in argument '{}'", value);

    const string_view slangName = value.substr(firstCommaIndex + 1);
    value = value.substr(0, firstCommaIndex);
    cmdRename[std::string(value)] = slangName;
    return {};
}